

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall
capnp::JsonCodec::Base64Handler::encode
          (Base64Handler *this,JsonCodec *codec,Reader input,Builder output)

{
  size_t sVar1;
  char *pcVar2;
  bool in_R8B;
  Reader value;
  ArrayPtr<const_unsigned_char> input_00;
  String local_38;
  PointerBuilder local_20;
  
  input_00.size_ = 0;
  input_00.ptr = (uchar *)input.super_ArrayPtr<const_unsigned_char>.size_;
  kj::encodeBase64(&local_38,(kj *)input.super_ArrayPtr<const_unsigned_char>.ptr,input_00,in_R8B);
  pcVar2 = local_38.content.ptr;
  if (local_38.content.size_ == 0) {
    pcVar2 = "";
  }
  value.super_StringPtr.content.size_ = local_38.content.size_ + (local_38.content.size_ == 0);
  *(undefined2 *)output._builder.data = 3;
  local_20.segment = output._builder.segment;
  local_20.capTable = output._builder.capTable;
  local_20.pointer = output._builder.pointers;
  value.super_StringPtr.content.ptr = pcVar2;
  capnp::_::PointerBuilder::setBlob<capnp::Text>(&local_20,value);
  sVar1 = local_38.content.size_;
  pcVar2 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar2,1,sVar1,sVar1,0);
  }
  return;
}

Assistant:

void encode(const JsonCodec& codec, capnp::Data::Reader input, JsonValue::Builder output) const {
    output.setString(kj::encodeBase64(input));
  }